

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tes2TestPackage.cpp
# Opt level: O0

void __thiscall deqp::gles2::TestPackage::~TestPackage(TestPackage *this)

{
  TestPackage *this_local;
  
  ~TestPackage(this);
  operator_delete(this,0xa8);
  return;
}

Assistant:

TestPackage::~TestPackage (void)
{
	// Destroy children first since destructors may access context.
	TestNode::deinit();
	delete m_context;
}